

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

_Bool ssh_share_test_for_upstream(char *host,int port,Conf *conf)

{
  Socket *local_58;
  Socket *sock;
  char *pcStack_48;
  int result;
  char *us_err;
  char *ds_err;
  char *logtext;
  char *sockname;
  Conf *conf_local;
  char *pcStack_18;
  int port_local;
  char *host_local;
  
  sockname = (char *)conf;
  conf_local._4_4_ = port;
  pcStack_18 = host;
  logtext = ssh_share_sockname(host,port,conf);
  local_58 = (Socket *)0x0;
  pcStack_48 = (char *)0x0;
  us_err = (char *)0x0;
  ds_err = (char *)0x0;
  sock._4_4_ = platform_ssh_share(logtext,(Conf *)sockname,&nullplug_plug,(Plug *)0x0,&local_58,
                                  &ds_err,&us_err,&stack0xffffffffffffffb8,false,true);
  safefree(ds_err);
  safefree(us_err);
  safefree(pcStack_48);
  safefree(logtext);
  if (sock._4_4_ == 0) {
    if (local_58 != (Socket *)0x0) {
      __assert_fail("sock == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                    ,0x7f4,"_Bool ssh_share_test_for_upstream(const char *, int, Conf *)");
    }
    host_local._7_1_ = false;
  }
  else {
    if (sock._4_4_ != 1) {
      __assert_fail("result == SHARE_DOWNSTREAM",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                    ,0x7f7,"_Bool ssh_share_test_for_upstream(const char *, int, Conf *)");
    }
    sk_close(local_58);
    host_local._7_1_ = true;
  }
  return host_local._7_1_;
}

Assistant:

bool ssh_share_test_for_upstream(const char *host, int port, Conf *conf)
{
    char *sockname, *logtext, *ds_err, *us_err;
    int result;
    Socket *sock;

    sockname = ssh_share_sockname(host, port, conf);

    sock = NULL;
    logtext = ds_err = us_err = NULL;
    result = platform_ssh_share(sockname, conf, nullplug, (Plug *)NULL, &sock,
                                &logtext, &ds_err, &us_err, false, true);

    sfree(logtext);
    sfree(ds_err);
    sfree(us_err);
    sfree(sockname);

    if (result == SHARE_NONE) {
        assert(sock == NULL);
        return false;
    } else {
        assert(result == SHARE_DOWNSTREAM);
        sk_close(sock);
        return true;
    }
}